

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIteratorImmutableExplicitCbeginCend(void)

{
  int iVar1;
  pointer piVar2;
  ostream *poVar3;
  int iVar4;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> values;
  allocator_type local_31;
  vector<int,_std::allocator<int>_> local_30;
  int local_18 [4];
  
  local_18[0] = 1;
  local_18[1] = 2;
  local_18[2] = 3;
  local_18[3] = 4;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_31);
  if ((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    piVar2 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar4 = 0;
    do {
      iVar1 = *piVar2;
      if (iVar1 != iVar4 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x142);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(*itr) == (++counter)",0x15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        iVar4 = 1;
        std::ostream::flush();
        goto LAB_001bdeb9;
      }
      piVar2 = piVar2 + 1;
      iVar4 = iVar1;
    } while (piVar2 != (int *)(((long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_finish -
                               (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) +
                              (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start));
    iVar4 = 0;
    if (iVar1 == 4) goto LAB_001bdeb9;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
             ,0x71);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x144);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(counter) == (4)",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  iVar4 = 1;
  std::ostream::flush();
LAB_001bdeb9:
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar4;
}

Assistant:

int testSpanTestsIteratorImmutableExplicitCbeginCend()
{
    const std::vector<int> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    int counter = 0;
    for (auto itr = span.cbegin(); itr != span.cend(); ++itr) {
        static_assert(std::is_same<decltype(*itr), const int&>::value, "iterator must be const");
        ML_ASSERT_EQ(*itr, ++counter);
    }
    ML_ASSERT_EQ(counter, 4);

    return 0;
}